

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# atf-c.c
# Opt level: O1

atf_error_t microatf_tp_add_tc(atf_tp_t *tp,atf_tc_t *tst)

{
  char *value;
  int iVar1;
  char *__s1;
  atf_error_t paVar2;
  
  value = tst->name;
  tst->impl_ = (atf_tc_impl_s_ *)&tst->field_0x20;
  atf_tc_set_md_var(tst,"ident",value);
  if (tst->head != (_func_void_atf_tc_t_ptr *)0x0) {
    (*tst->head)(tst);
  }
  __s1 = atf_tc_get_md_var(tst,"ident");
  paVar2 = (atf_error_t)0x5;
  if (__s1 != (char *)0x0) {
    iVar1 = strcmp(__s1,value);
    if (iVar1 == 0) {
      (tst->impl_->entries).next = (atf_tc_s *)0x0;
      *(tp->tcs).last = tst;
      (tp->tcs).last = &(tst->impl_->entries).next;
      paVar2 = (atf_error_t)0x0;
    }
  }
  return paVar2;
}

Assistant:

atf_error_t
microatf_tp_add_tc(atf_tp_t *tp, atf_tc_t *tst)
{
	char const *ident = tst->name;

	tst->impl_ = (struct atf_tc_impl_s_ *)&tst->impl_space_;

	atf_tc_set_md_var(tst, "ident", ident);
	if (tst->head != NULL) {
		tst->head(tst);
	}

	char const *new_ident = atf_tc_get_md_var(tst, "ident");
	if (new_ident == NULL || strcmp(new_ident, ident) != 0) {
		return microatf_error_initialization_error();
	}

	STAILQ_INSERT_TAIL(&tp->tcs, tst, impl_->entries);
	return 0;
}